

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool ON_String::EqualOrdinal
               (char *string1,int element_count1,char *string2,int element_count2,
               bool bOrdinalIgnoreCase)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char null_terminator;
  char local_39;
  uint local_38;
  uint local_34;
  
  bVar1 = string2 == (char *)0x0;
  if ((string1 != (char *)0x0 || element_count1 == 0) &&
     (bVar1 = string1 == (char *)0x0, string2 != (char *)0x0 || element_count2 == 0)) {
    local_39 = '\0';
    if (element_count1 < 0) {
      element_count1 = Length(string1);
    }
    if (element_count2 < 0) {
      element_count2 = Length(string2);
    }
    if (element_count1 == 0) {
      string1 = &local_39;
    }
    if (element_count2 == 0) {
      string2 = &local_39;
    }
    bVar1 = true;
    if (element_count1 != element_count2 || string1 != string2) {
      local_38 = element_count2;
      if (element_count1 < element_count2) {
        element_count2 = element_count1;
      }
      uVar4 = 0;
      if (0 < element_count2) {
        uVar4 = element_count2;
      }
      local_34 = uVar4;
      uVar6 = (ulong)uVar4;
      if (bOrdinalIgnoreCase) {
        for (lVar7 = 0; uVar4 != (uint)lVar7; lVar7 = lVar7 + 1) {
          uVar2 = OrdinalUTF8ToIgnoreCase(string1[lVar7]);
          uVar3 = OrdinalUTF8ToIgnoreCase(string2[lVar7]);
          if (uVar2 != uVar3) {
            return false;
          }
        }
      }
      else {
        for (lVar7 = 0; uVar4 != (uint)lVar7; lVar7 = lVar7 + 1) {
          if (string1[lVar7] != string2[lVar7]) {
            return false;
          }
        }
      }
      pcVar5 = string2 + uVar6;
      if ((int)local_34 <= element_count1) {
        local_34 = element_count1;
      }
      for (; (int)uVar6 < element_count1; uVar6 = uVar6 + 1) {
        if (string1[uVar6] != '\0') {
          return false;
        }
      }
      for (; (bVar1 = (int)local_38 <= (int)local_34, (int)local_34 < (int)local_38 &&
             (*pcVar5 == '\0')); pcVar5 = pcVar5 + 1) {
        local_34 = local_34 + 1;
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(string1,element_count1,string2,element_count2);

  const int element_count = (element_count1 <= element_count2) ? element_count1 : element_count2;
  int i;
  if (bOrdinalIgnoreCase)
  {
    unsigned int c1, c2;
    for(i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i = 0; i < element_count; i++)
    {
      if ((*string1++) != (*string2++))
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return false;
  }

  return true;
}